

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rhash.c
# Opt level: O3

int rhash_file_update(rhash ctx,FILE *fd)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  size_t length;
  
  iVar2 = 0;
  if (ctx[1].hash_id == 0xb01dbabe) {
    pvVar3 = malloc(0x2008);
    if (pvVar3 == (void *)0x0) {
      iVar2 = -1;
    }
    else {
      pvVar3 = (void *)((ulong)(-(int)pvVar3 & 7) + (long)pvVar3);
      iVar1 = feof((FILE *)fd);
      while( true ) {
        iVar2 = 0;
        if ((iVar1 != 0) || (iVar2 = 0, ctx[1].hash_id != 0xb01dbabe)) goto LAB_001bcbd1;
        length = fread(pvVar3,1,0x2000,(FILE *)fd);
        iVar2 = ferror((FILE *)fd);
        if (iVar2 != 0) break;
        if (length != 0) {
          rhash_update(ctx,pvVar3,length);
          if ((code *)ctx[2].msg_size != (code *)0x0) {
            (*(code *)ctx[2].msg_size)(*(undefined8 *)&ctx[2].hash_id,ctx->msg_size);
          }
        }
        iVar1 = feof((FILE *)fd);
      }
      iVar2 = -1;
LAB_001bcbd1:
      free(pvVar3);
    }
  }
  return iVar2;
}

Assistant:

RHASH_API int rhash_file_update(rhash ctx, FILE* fd)
{
	rhash_context_ext* const ectx = (rhash_context_ext*)ctx;
	const size_t block_size = 8192;
	unsigned char *buffer, *pmem;
	size_t length = 0, align8;
	int res = 0;
	if (ectx->state != STATE_ACTIVE) return 0; /* do nothing if canceled */

	if (ctx == NULL) {
		errno = EINVAL;
		return -1;
	}

	pmem = (unsigned char*)malloc(block_size + 8);
	if (!pmem) return -1; /* errno is set to ENOMEM according to UNIX 98 */

	align8 = ((unsigned char*)0 - pmem) & 7;
	buffer = pmem + align8;

	while (!feof(fd)) {
		/* stop if canceled */
		if (ectx->state != STATE_ACTIVE) break;

		length = fread(buffer, 1, block_size, fd);

		if (ferror(fd)) {
			res = -1; /* note: errno contains error code */
			break;
		} else if (length) {
			rhash_update(ctx, buffer, length);

			if (ectx->callback) {
				((rhash_callback_t)ectx->callback)(ectx->callback_data, ectx->rc.msg_size);
			}
		}
	}

	free(buffer);
	return res;
}